

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O1

value * __thiscall
mjs::anon_unknown_46::json_walk
          (value *__return_storage_ptr__,anon_unknown_46 *this,
          gc_heap_ptr<mjs::global_object> *global,value *reviver,object_ptr *holder,
          wstring_view name)

{
  pointer psVar1;
  value *__return_storage_ptr___00;
  bool bVar2;
  uint32_t uVar3;
  undefined8 *puVar4;
  long *plVar5;
  object *this_00;
  uint *puVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar7;
  gc_heap *this_01;
  long lVar8;
  uint uVar9;
  mjs *this_02;
  initializer_list<mjs::value> __l;
  wstring is;
  vector<mjs::string,_std::allocator<mjs::string>_> keys;
  value val;
  value new_element;
  wstring_view in_stack_fffffffffffffec8;
  undefined1 local_128 [8];
  undefined1 local_120 [8];
  undefined1 local_118 [24];
  wstring_view local_100;
  vector<mjs::string,_std::allocator<mjs::string>_> local_f0;
  value *local_d8;
  gc_heap *local_d0;
  undefined1 local_c8 [8];
  undefined1 local_c0 [32];
  undefined1 local_a0 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_98;
  value local_78;
  value *local_50;
  value *local_48;
  wstring_view local_40;
  
  local_d0 = *(gc_heap **)this;
  local_d8 = (value *)global;
  local_50 = __return_storage_ptr__;
  local_48 = reviver;
  local_40._M_len = (size_t)holder;
  puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)reviver);
  (**(code **)*puVar4)(local_c8,puVar4,&local_40);
  if (local_c8._0_4_ == object) {
    bVar2 = is_array((object_ptr *)local_c0);
    if (bVar2) {
      puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_c0);
      local_128 = (undefined1  [8])0x6;
      local_120 = (undefined1  [8])0x208644;
      (**(code **)*puVar4)(local_a0,puVar4);
      uVar3 = to_uint32((value *)local_a0);
      value::destroy((value *)local_a0);
      if (uVar3 != 0) {
        this_02 = (mjs *)0x0;
        uVar7 = extraout_RDX;
        do {
          index_string_abi_cxx11_((wstring *)local_128,this_02,(uint32_t)uVar7);
          json_walk((value *)local_a0,this,(gc_heap_ptr<mjs::global_object> *)local_d8,
                    (value *)local_c0,(object_ptr *)local_120,in_stack_fffffffffffffec8);
          if (local_a0._0_4_ == undefined) {
            plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_c0);
            local_f0.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_120;
            local_f0.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)local_128;
            (**(code **)(*plVar5 + 0x10))(plVar5,(gc_heap_ptr_untyped *)&local_f0);
          }
          else {
            plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_c0);
            local_100._M_len = (size_t)local_120;
            local_100._M_str = (wchar_t *)local_128;
            string::string((string *)&local_f0,local_d0,&local_100);
            (**(code **)(*plVar5 + 8))(plVar5,(gc_heap_ptr_untyped *)&local_f0,(value *)local_a0,0);
            gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f0);
          }
          value::destroy((value *)local_a0);
          uVar7 = extraout_RDX_00;
          if (local_128 != (undefined1  [8])local_118) {
            operator_delete((void *)local_128,CONCAT44(local_118._4_4_,local_118._0_4_) * 4 + 4);
            uVar7 = extraout_RDX_01;
          }
          uVar9 = (int)this_02 + 1;
          this_02 = (mjs *)(ulong)uVar9;
        } while (uVar3 != uVar9);
      }
    }
    else {
      this_00 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_c0);
      object::own_property_names(&local_f0,this_00,true);
      psVar1 = local_f0.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (local_f0.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_f0.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_01 = (gc_heap *)
                  local_f0.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          puVar6 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
          local_128 = (undefined1  [8])local_118;
          std::__cxx11::wstring::_M_construct<wchar_t_const*>
                    ((wstring *)local_128,puVar6 + 1,puVar6 + (ulong)*puVar6 + 1);
          json_walk((value *)local_a0,this,(gc_heap_ptr<mjs::global_object> *)local_d8,
                    (value *)local_c0,(object_ptr *)local_120,in_stack_fffffffffffffec8);
          if (local_a0._0_4_ == undefined) {
            plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_c0);
            puVar6 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
            local_100._M_str = (wchar_t *)(puVar6 + 1);
            local_100._M_len = (size_t)*puVar6;
            (**(code **)(*plVar5 + 0x10))(plVar5,&local_100);
          }
          else {
            plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_c0);
            (**(code **)(*plVar5 + 8))(plVar5,this_01,(value *)local_a0,0);
          }
          value::destroy((value *)local_a0);
          if (local_128 != (undefined1  [8])local_118) {
            operator_delete((void *)local_128,CONCAT44(local_118._4_4_,local_118._0_4_) * 4 + 4);
          }
          this_01 = (gc_heap *)&this_01->alloc_context_;
        } while (this_01 != (gc_heap *)psVar1);
      }
      std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector(&local_f0);
    }
  }
  local_128._0_4_ = 5;
  local_120 = *(undefined1 (*) [8])local_48;
  local_118._0_4_ = *(undefined4 *)&local_48->field_1;
  if (local_120 != (undefined1  [8])0x0) {
    gc_heap::attach((gc_heap *)local_120,(gc_heap_ptr_untyped *)local_120);
  }
  string::string((string *)&local_100,local_d0,&local_40);
  __return_storage_ptr___00 = local_50;
  local_a0._0_4_ = string;
  local_98.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)local_100._M_len;
  local_98.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
       (uint32_t)local_100._M_str;
  if ((gc_heap *)local_100._M_len != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_100._M_len,(gc_heap_ptr_untyped *)(local_a0 + 8));
  }
  value::value((value *)(local_a0 + 0x28),(value *)local_c8);
  __l._M_len = 2;
  __l._M_array = (iterator)local_a0;
  std::vector<mjs::value,_std::allocator<mjs::value>_>::vector
            ((vector<mjs::value,_std::allocator<mjs::value>_> *)&local_f0,__l,
             (allocator_type *)&stack0xfffffffffffffed7);
  call_function(__return_storage_ptr___00,local_d8,(value *)local_128,
                (vector<mjs::value,_std::allocator<mjs::value>_> *)&local_f0);
  std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector
            ((vector<mjs::value,_std::allocator<mjs::value>_> *)&local_f0);
  lVar8 = 0x28;
  do {
    value::destroy((value *)(local_a0 + lVar8));
    lVar8 = lVar8 + -0x28;
  } while (lVar8 != -0x28);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_100);
  value::destroy((value *)local_128);
  value::destroy((value *)local_c8);
  return __return_storage_ptr___00;
}

Assistant:

value json_walk(const gc_heap_ptr<global_object>& global, const value& reviver, const object_ptr& holder, const std::wstring_view name) {
    auto& h = global.heap();

    const auto val = holder->get(name);
    if (val.type() == value_type::object) {
        const auto& o = val.object_value();
        if (is_array(o)) {
            const uint32_t len = to_uint32(o->get(L"length"));
            for (uint32_t i = 0; i < len; ++i) {
                const auto is = index_string(i);
                auto new_element = json_walk(global, reviver, o, is);
                if (new_element.type() == value_type::undefined) {
                    o->delete_property(is);
                } else {
                    o->put(string{h, is}, new_element);
                }
            }
        } else {
            const auto keys = o->own_property_names(true);
            for (const auto& p: keys) {
                const std::wstring key{p.view()}; // Keep local copy in case p gets moved during the walk
                auto new_element = json_walk(global, reviver, o, key);
                if (new_element.type() == value_type::undefined) {
                    o->delete_property(p.view());
                } else {
                    o->put(p, new_element);
                }
            }
        }
    }
    return call_function(reviver, value{holder}, { value{string{h, name}}, val });
}